

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocs.c
# Opt level: O2

void add_reloc(int sym_id,int section_id,int offset,int relative)

{
  reloc_s *prVar1;
  reloc_t **pprVar2;
  
  prVar1 = (reloc_s *)mmalloc(0x18);
  prVar1->sym_id = sym_id;
  prVar1->section_id = section_id;
  prVar1->offset = offset;
  prVar1->flags = (uint)(relative != 0);
  prVar1->next = (reloc_s *)0x0;
  pprVar2 = &cur->next;
  if (root == (reloc_t *)0x0) {
    pprVar2 = &root;
  }
  *pprVar2 = prVar1;
  cur = prVar1;
  relocs_count = relocs_count + 1;
  return;
}

Assistant:

void add_reloc(int sym_id, int section_id, int offset, int relative)
{
    reloc_t* new = (reloc_t*)mmalloc(sizeof(reloc_t));
    new->sym_id = sym_id;
    new->section_id = section_id;
    new->offset = offset;
    if (relative)
        new->flags = 1;
    else
        new->flags = 0;
    new->next = NULL;
    
    if (root == NULL)
    {
        root = new;
        cur = root;
    }
    else
    {
        cur->next = new;
        cur = new;
    }
        
    ++relocs_count;
}